

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

reference<mpt::pipe<int>::instance> * __thiscall mpt::pipe<int>::ref(pipe<int> *this)

{
  instance *this_00;
  
  if ((this->_d)._ref == (instance *)0x0) {
    this_00 = (instance *)operator_new(0x30);
    instance::instance(this_00);
    reference<mpt::pipe<int>::instance>::set_instance(&this->_d,this_00);
  }
  return &this->_d;
}

Assistant:

const reference<instance> &ref()
	{
		if (!_d.instance()) {
			_d.set_instance(new instance);
		}
		return _d;
	}